

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O0

int32 model_def_write(model_def_t *mdef,char *fn)

{
  FILE *pFVar1;
  uint32 uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  uint local_64;
  uint32 i;
  char *wp2c;
  word_posn_t local_50;
  uint32 p;
  word_posn_t wp;
  acmod_id_t r;
  acmod_id_t l;
  acmod_id_t b;
  char **attrib;
  acmod_set_t *acmod_set;
  uint32 n_acmod;
  uint32 n_ci;
  FILE *fp;
  char *fn_local;
  model_def_t *mdef_local;
  
  fp = (FILE *)fn;
  fn_local = (char *)mdef;
  _n_acmod = fopen(fn,"w");
  if (_n_acmod == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                   ,0x124,"Unable to open %s for writing",fp);
    mdef_local._4_4_ = -1;
  }
  else {
    attrib = *(char ***)fn_local;
    fprintf(_n_acmod,"%s\n","0.3");
    acmod_set._4_4_ = acmod_set_n_ci((acmod_set_t *)attrib);
    fprintf(_n_acmod,"%u n_base\n",(ulong)acmod_set._4_4_);
    pFVar1 = _n_acmod;
    uVar2 = acmod_set_n_multi((acmod_set_t *)attrib);
    fprintf(pFVar1,"%u n_tri\n",(ulong)uVar2);
    fprintf(_n_acmod,"%u n_state_map\n",(ulong)*(uint *)(fn_local + 0x14));
    fprintf(_n_acmod,"%u n_tied_state\n",(ulong)*(uint *)(fn_local + 0x1c));
    fprintf(_n_acmod,"%u n_tied_ci_state\n",(ulong)*(uint *)(fn_local + 0x18));
    fprintf(_n_acmod,"%u n_tied_tmat\n",(ulong)*(uint *)(fn_local + 0x20));
    fprintf(_n_acmod,"#\n# Columns definitions\n");
    pcVar4 = "attrib";
    pcVar5 = "tmat";
    pcVar6 = "     ... state id\'s ...";
    fprintf(_n_acmod,"#%4s %3s %3s %1s %6s %4s %s\n","base","lft","rt","p","attrib","tmat",
            "     ... state id\'s ...");
    acmod_set._0_4_ = acmod_set_n_acmod((acmod_set_t *)attrib);
    for (wp2c._4_4_ = 0; pFVar1 = _n_acmod, wp2c._4_4_ < acmod_set._4_4_;
        wp2c._4_4_ = wp2c._4_4_ + 1) {
      pcVar3 = acmod_set_id2name((acmod_set_t *)attrib,wp2c._4_4_);
      fprintf(pFVar1,"%5s %3s %3s %1s",pcVar3,"-","-","-",pcVar4,pcVar5,pcVar6);
      _l = acmod_set_attrib((acmod_set_t *)attrib,wp2c._4_4_);
      if ((_l == (char **)0x0) || (*_l == (char *)0x0)) {
        fprintf(_n_acmod," %6s","n/a");
      }
      else {
        fprintf(_n_acmod," %6s",*_l);
        for (local_64 = 1; _l[local_64] != (char *)0x0; local_64 = local_64 + 1) {
          fprintf(_n_acmod,",%s",_l[local_64]);
        }
      }
      fprintf(_n_acmod," %4d",
              (ulong)*(uint *)(*(long *)(fn_local + 8) + (ulong)wp2c._4_4_ * 0x20 + 4));
      for (local_64 = 0;
          local_64 < *(uint *)(*(long *)(fn_local + 8) + (ulong)wp2c._4_4_ * 0x20 + 0x10);
          local_64 = local_64 + 1) {
        if (*(int *)(*(long *)(*(long *)(fn_local + 8) + (ulong)wp2c._4_4_ * 0x20 + 8) +
                    (ulong)local_64 * 4) == -1) {
          fprintf(_n_acmod," N");
        }
        else {
          fprintf(_n_acmod," %6u",
                  (ulong)*(uint *)(*(long *)(*(long *)(fn_local + 8) + (ulong)wp2c._4_4_ * 0x20 + 8)
                                  + (ulong)local_64 * 4));
        }
      }
      fprintf(_n_acmod,"\n");
    }
    for (; wp2c._4_4_ < (uint32)acmod_set; wp2c._4_4_ = wp2c._4_4_ + 1) {
      acmod_set_id2tri((acmod_set_t *)attrib,&r,&wp,&p,&local_50,wp2c._4_4_);
      pFVar1 = _n_acmod;
      pcVar4 = acmod_set_id2name((acmod_set_t *)attrib,r);
      pcVar5 = acmod_set_id2name((acmod_set_t *)attrib,wp);
      pcVar6 = acmod_set_id2name((acmod_set_t *)attrib,p);
      fprintf(pFVar1,"%5s %3s %3s %c",pcVar4,pcVar5,pcVar6,(ulong)(uint)(int)"besiu"[local_50]);
      _l = acmod_set_attrib((acmod_set_t *)attrib,wp2c._4_4_);
      if ((_l == (char **)0x0) || (*_l == (char *)0x0)) {
        fprintf(_n_acmod," %6s","n/a");
      }
      else {
        fprintf(_n_acmod," %6s",*_l);
        for (local_64 = 1; _l[local_64] != (char *)0x0; local_64 = local_64 + 1) {
          fprintf(_n_acmod,",%s",_l[local_64]);
        }
      }
      fprintf(_n_acmod," %4d",
              (ulong)*(uint *)(*(long *)(fn_local + 8) + (ulong)wp2c._4_4_ * 0x20 + 4));
      for (local_64 = 0;
          local_64 < *(uint *)(*(long *)(fn_local + 8) + (ulong)wp2c._4_4_ * 0x20 + 0x10);
          local_64 = local_64 + 1) {
        if (*(int *)(*(long *)(*(long *)(fn_local + 8) + (ulong)wp2c._4_4_ * 0x20 + 8) +
                    (ulong)local_64 * 4) == -1) {
          fprintf(_n_acmod," N");
        }
        else {
          fprintf(_n_acmod," %6u",
                  (ulong)*(uint *)(*(long *)(*(long *)(fn_local + 8) + (ulong)wp2c._4_4_ * 0x20 + 8)
                                  + (ulong)local_64 * 4));
        }
      }
      fprintf(_n_acmod,"\n");
    }
    fclose(_n_acmod);
    mdef_local._4_4_ = 0;
  }
  return mdef_local._4_4_;
}

Assistant:

int32
model_def_write(model_def_t *mdef,
		const char *fn)
{
    FILE *fp;
    uint32 n_ci;
    uint32 n_acmod;
    acmod_set_t *acmod_set;
    const char **attrib;
    acmod_id_t b;
    acmod_id_t l;
    acmod_id_t r;
    word_posn_t wp;
    uint32 p;
    char *wp2c = WORD_POSN_CHAR_MAP;
    uint32 i;

    fp = fopen(fn, "w");
    if (fp == NULL) {
	E_ERROR_SYSTEM("Unable to open %s for writing", fn);
	return S3_ERROR;
    }

    acmod_set = mdef->acmod_set;

    fprintf(fp, "%s\n", MODEL_DEF_VERSION);
    n_ci = acmod_set_n_ci(acmod_set);
    fprintf(fp, "%u n_base\n", n_ci);
    fprintf(fp, "%u n_tri\n", acmod_set_n_multi(acmod_set));
    fprintf(fp, "%u n_state_map\n", mdef->n_total_state);
    fprintf(fp, "%u n_tied_state\n", mdef->n_tied_state);
    fprintf(fp, "%u n_tied_ci_state\n", mdef->n_tied_ci_state);
    fprintf(fp, "%u n_tied_tmat\n", mdef->n_tied_tmat);
    fprintf(fp, "#\n# Columns definitions\n");
    fprintf(fp, "#%4s %3s %3s %1s %6s %4s %s\n",
	    "base", "lft", "rt", "p", "attrib", "tmat",
	    "     ... state id's ...");

    n_acmod = acmod_set_n_acmod(acmod_set);
    for (p = 0; p < n_ci; p++) {
	fprintf(fp, "%5s %3s %3s %1s",
		acmod_set_id2name(acmod_set, p),
		"-", "-", "-");

	attrib = acmod_set_attrib(acmod_set, p);
	if ((attrib == NULL) || (attrib[0] == NULL)) {
	    fprintf(fp, " %6s", "n/a");
	}
	else {
	    fprintf(fp, " %6s", attrib[0]);

	    for (i = 1; attrib[i]; i++) {
		fprintf(fp, ",%s", attrib[i]);
	    }
	}
	fprintf(fp, " %4d", mdef->defn[p].tmat);

	for (i = 0; i < mdef->defn[p].n_state; i++) {
	    if (mdef->defn[p].state[i] == NO_ID) {
		fprintf(fp, " N");
	    }
	    else {
		fprintf(fp, " %6u", mdef->defn[p].state[i]);
	    }
	}
	fprintf(fp, "\n");
    }

    for (; p < n_acmod; p++) {
	acmod_set_id2tri(acmod_set,
			 &b, &l, &r, &wp,
			 p);
	
	fprintf(fp, "%5s %3s %3s %c",
		acmod_set_id2name(acmod_set, b),
		acmod_set_id2name(acmod_set, l),
		acmod_set_id2name(acmod_set, r),
		wp2c[(uint32)wp]);

	attrib = acmod_set_attrib(acmod_set, p);
	if ((attrib == NULL) || (attrib[0] == NULL)) {
	    fprintf(fp, " %6s", "n/a");
	}
	else {
	    fprintf(fp, " %6s", attrib[0]);

	    for (i = 1; attrib[i]; i++) {
		fprintf(fp, ",%s", attrib[i]);
	    }
	}
	fprintf(fp, " %4d", mdef->defn[p].tmat);

	for (i = 0; i < mdef->defn[p].n_state; i++) {
	    if (mdef->defn[p].state[i] == NO_ID) {
		fprintf(fp, " N");
	    }
	    else {
		fprintf(fp, " %6u", mdef->defn[p].state[i]);
	    }
	}
	fprintf(fp, "\n");
    }

    fclose(fp);

    return S3_SUCCESS;
}